

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O0

element * __thiscall MinVR::element::add_child_element(element *this)

{
  element *this_00;
  iterator iVar1;
  reference ppeVar2;
  element *in_RDI;
  element *child;
  list<MinVR::element_*,_std::allocator<MinVR::element_*>_> *in_stack_ffffffffffffffb8;
  element *in_stack_ffffffffffffffd0;
  
  this_00 = (element *)operator_new(0xb0);
  element(in_stack_ffffffffffffffd0);
  set_parent(this_00,in_RDI);
  std::__cxx11::list<MinVR::element_*,_std::allocator<MinVR::element_*>_>::push_back
            ((list<MinVR::element_*,_std::allocator<MinVR::element_*>_> *)in_stack_ffffffffffffffd0,
             (value_type *)this_00);
  iVar1 = std::__cxx11::list<MinVR::element_*,_std::allocator<MinVR::element_*>_>::end
                    (in_stack_ffffffffffffffb8);
  (in_RDI->i)._M_node = iVar1._M_node;
  iVar1 = std::__cxx11::list<MinVR::element_*,_std::allocator<MinVR::element_*>_>::begin
                    (in_stack_ffffffffffffffb8);
  (in_RDI->m_element_iterator)._M_node = iVar1._M_node;
  std::_List_iterator<MinVR::element_*>::operator--(&in_RDI->i);
  ppeVar2 = std::_List_iterator<MinVR::element_*>::operator*
                      ((_List_iterator<MinVR::element_*> *)0x16a179);
  return *ppeVar2;
}

Assistant:

element* element::add_child_element()
{
    element* child = new element();
    child->set_parent(this);
    m_element_list.push_back(child);
    i = m_element_list.end();
    m_element_iterator = m_element_list.begin();
    return (*(--i));
}